

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# if_conversion.cpp
# Opt level: O0

bool __thiscall spvtools::opt::IfConversion::CheckType(IfConversion *this,uint32_t id)

{
  Op opcode;
  int32_t iVar1;
  DefUseManager *this_00;
  Instruction *this_01;
  Op op;
  Instruction *type;
  uint32_t id_local;
  IfConversion *this_local;
  
  this_00 = Pass::get_def_use_mgr(&this->super_Pass);
  this_01 = analysis::DefUseManager::GetDef(this_00,id);
  opcode = Instruction::opcode(this_01);
  iVar1 = spvOpcodeIsScalarType(opcode);
  if (((iVar1 == 0) && (opcode != OpTypePointer)) && (opcode != OpTypeVector)) {
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool IfConversion::CheckType(uint32_t id) {
  Instruction* type = get_def_use_mgr()->GetDef(id);
  spv::Op op = type->opcode();
  if (spvOpcodeIsScalarType(op) || op == spv::Op::OpTypePointer ||
      op == spv::Op::OpTypeVector)
    return true;
  return false;
}